

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_sign_with_k(uint8_t *private_key,uint8_t *message_hash,uECC_word_t *k,uint8_t *signature)

{
  uECC_word_t *puVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 auStack_d8 [8];
  EccPoint p;
  uECC_word_t s [4];
  uECC_word_t *k2 [2];
  uECC_word_t uStack_58;
  uECC_word_t tmp [4];
  
  s[3] = (uECC_word_t)&uStack_58;
  lVar8 = 0;
  do {
    puVar1 = k + lVar8;
    if (*puVar1 != 0) break;
    bVar12 = lVar8 != 3;
    lVar8 = lVar8 + 1;
  } while (bVar12);
  iVar5 = 0;
  if (*puVar1 != 0) {
    uVar7 = 3;
    do {
      uVar6 = curve_n[uVar7];
      uVar3 = k[uVar7];
      if (uVar3 < uVar6) goto LAB_00104374;
      bVar12 = uVar7 != 0;
      uVar7 = uVar7 - 1;
    } while ((bVar12) && (uVar3 <= uVar6));
    iVar5 = 0;
    if (uVar3 < uVar6) {
LAB_00104374:
      lVar8 = 0;
      uVar6 = 0;
      do {
        uVar3 = *(ulong *)((long)k + lVar8);
        uVar11 = uVar3 + uVar6 + *(long *)((long)curve_n + lVar8);
        uVar10 = (ulong)(uVar11 < uVar3);
        if (uVar11 == uVar3) {
          uVar10 = uVar6;
        }
        *(ulong *)((long)tmp + lVar8 + -8) = uVar11;
        lVar8 = lVar8 + 8;
        uVar6 = uVar10;
      } while (lVar8 != 0x20);
      lVar8 = 0;
      uVar6 = 0;
      do {
        uVar3 = *(ulong *)((long)tmp + lVar8 + -8);
        uVar11 = uVar3 + uVar6 + *(long *)((long)curve_n + lVar8);
        if (uVar11 != uVar3) {
          uVar6 = (ulong)(uVar11 < uVar3);
        }
        *(ulong *)((long)p.y + lVar8 + 0x18) = uVar11;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      EccPoint_mult((EccPoint *)auStack_d8,&curve_G,(uECC_word_t *)s[(uVar10 ^ 1) + 3],
                    (uECC_word_t *)0x0,(uint)(uVar11 < uVar3));
      uVar6 = 3;
      do {
        iVar5 = (int)uVar6;
        uVar3 = curve_n[uVar6];
        uVar10 = p.x[uVar6 - 1];
        if (uVar10 < uVar3) goto LAB_00104442;
        uVar6 = (ulong)(iVar5 - 1);
      } while ((iVar5 != 0) && (uVar10 <= uVar3));
      if (uVar3 <= uVar10) {
        lVar8 = 0;
        uVar6 = 0;
        do {
          uVar10 = *(long *)((long)curve_n + lVar8) + uVar6;
          puVar2 = (ulong *)((long)p.x + lVar8 + -8);
          uVar3 = *puVar2;
          *puVar2 = *puVar2 - uVar10;
          if (uVar10 != 0) {
            uVar6 = (ulong)(uVar3 < uVar10);
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x20);
      }
LAB_00104442:
      lVar8 = 0;
      do {
        lVar9 = lVar8 + -1;
        if (p.x[lVar9] != 0) break;
        bVar12 = lVar8 != 3;
        lVar8 = lVar8 + 1;
      } while (bVar12);
      if (p.x[lVar9] == 0) {
        iVar5 = 0;
      }
      else {
        lVar8 = 0;
        bVar12 = false;
        do {
          iVar5 = (*g_rng_function)((uint8_t *)&uStack_58,0x20);
          if (iVar5 != 0) {
            lVar9 = 0;
            do {
              lVar4 = lVar9 + -1;
              if (tmp[lVar4] != 0) break;
              bVar12 = lVar9 != 3;
              lVar9 = lVar9 + 1;
            } while (bVar12);
            bVar12 = true;
            if (tmp[lVar4] != 0) break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x40);
        if (!bVar12) {
          tmp[0] = 0;
          tmp[1] = 0;
          tmp[2] = 0;
          uStack_58 = 1;
        }
        vli_modMult_n(k,k,&uStack_58);
        vli_modInv(k,k,curve_n);
        vli_modMult_n(k,k,&uStack_58);
        vli_nativeToBytes(signature,(uint64_t *)auStack_d8);
        tmp[2] = 0;
        vli_bytesToNative(&uStack_58,private_key);
        puVar1 = p.y + 3;
        p.y[3] = (uECC_word_t)auStack_d8;
        s[0] = p.x[0];
        s[1] = p.x[1];
        s[2] = p.x[2];
        vli_modMult_n(puVar1,&uStack_58,puVar1);
        vli_bytesToNative(&uStack_58,message_hash);
        vli_modAdd(puVar1,&uStack_58,puVar1,curve_n);
        vli_modMult_n(puVar1,puVar1,k);
        vli_nativeToBytes(signature + 0x20,puVar1);
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

static int uECC_sign_with_k(const uint8_t private_key[uECC_BYTES],
                            const uint8_t message_hash[uECC_BYTES],
                            uECC_word_t k[uECC_N_WORDS],
                            uint8_t signature[uECC_BYTES*2]) {
    uECC_word_t tmp[uECC_N_WORDS];
    uECC_word_t s[uECC_N_WORDS];
    uECC_word_t *k2[2] = {tmp, s};
    EccPoint p;
    uECC_word_t carry;
    uECC_word_t tries;

    /* Make sure 0 < k < curve_n */
    if (vli_isZero(k) || vli_cmp_n(curve_n, k) != 1) {
        return 0;
    }

#if (uECC_CURVE == uECC_secp160r1)
    /* Make sure that we don't leak timing information about k.
       See http://eprint.iacr.org/2011/232.pdf */
    vli_add_n(tmp, k, curve_n);
    carry = (tmp[uECC_WORDS] & 0x02);
    vli_add_n(s, tmp, curve_n);

    /* p = k * G */
    EccPoint_mult(&p, &curve_G, k2[!carry], 0, (uECC_BYTES * 8) + 2);
#else
    /* Make sure that we don't leak timing information about k.
       See http://eprint.iacr.org/2011/232.pdf */
    carry = vli_add(tmp, k, curve_n);
    vli_add(s, tmp, curve_n);

    /* p = k * G */
    EccPoint_mult(&p, &curve_G, k2[!carry], 0, (uECC_BYTES * 8) + 1);

    /* r = x1 (mod n) */
    if (vli_cmp(curve_n, p.x) != 1) {
        vli_sub(p.x, p.x, curve_n);
    }
#endif
    if (vli_isZero(p.x)) {
        return 0;
    }

    // Attempt to get a random number to prevent side channel analysis of k.
    // If the RNG fails every time (eg it was not defined), we continue so that
    // deterministic signing can still work (with reduced security) without
    // an RNG defined.
    carry = 0; // use to signal that the RNG succeeded at least once.
    for (tries = 0; tries < MAX_TRIES; ++tries) {
        if (!g_rng_function((uint8_t *)tmp, sizeof(tmp))) {
            continue;
        }
        carry = 1;
        if (!vli_isZero(tmp)) {
            break;
        }
    }
    if (!carry) {
        vli_clear(tmp);
        tmp[0] = 1;
    }

    /* Prevent side channel analysis of vli_modInv() to determine
       bits of k / the private key by premultiplying by a random number */
    vli_modMult_n(k, k, tmp); /* k' = rand * k */
    vli_modInv_n(k, k, curve_n); /* k = 1 / k' */
    vli_modMult_n(k, k, tmp); /* k = 1 / k */

    vli_nativeToBytes(signature, p.x); /* store r */

    tmp[uECC_N_WORDS - 1] = 0;
    vli_bytesToNative(tmp, private_key); /* tmp = d */
    s[uECC_N_WORDS - 1] = 0;
    vli_set(s, p.x);
    vli_modMult_n(s, tmp, s); /* s = r*d */

    vli_bytesToNative(tmp, message_hash);
    vli_modAdd_n(s, tmp, s, curve_n); /* s = e + r*d */
    vli_modMult_n(s, s, k); /* s = (e + r*d) / k */
#if (uECC_CURVE == uECC_secp160r1)
    if (s[uECC_N_WORDS - 1]) {
        return 0;
    }
#endif
    vli_nativeToBytes(signature + uECC_BYTES, s);
    return 1;
}